

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

bool __thiscall
JsUtil::
BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
::Remove(BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
         *this,FunctionBody **key)

{
  int iVar1;
  int *piVar2;
  SimpleHashedEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
  *pSVar3;
  FunctionBody *pFVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint depth;
  FunctionBody *local_38;
  
  piVar2 = (this->buckets).ptr;
  depth = 0;
  if (piVar2 != (int *)0x0) {
    uVar5 = GetBucket((uint)((ulong)*key >> 3) | 1,this->bucketCount,this->modFunctionIndex);
    uVar7 = piVar2[uVar5];
    depth = 0;
    if (-1 < (long)(int)uVar7) {
      pSVar3 = (this->entries).ptr;
      pFVar4 = pSVar3[(int)uVar7].
               super_DefaultHashedEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
               .
               super_ImplicitKeyValueEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
               .
               super_ValueEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::ValueEntryData<Memory::WriteBarrierPtr<Js::FunctionBody>_>_>
               .super_ValueEntryData<Memory::WriteBarrierPtr<Js::FunctionBody>_>.value.ptr;
      Memory::Recycler::WBSetBit((char *)&local_38);
      local_38 = pFVar4;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_38);
      if (local_38 == *key) {
        depth = 0;
        uVar6 = 0xffffffff;
      }
      else {
        depth = 0;
        do {
          uVar6 = uVar7;
          depth = depth + 1;
          uVar7 = pSVar3[uVar6].
                  super_DefaultHashedEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                  .
                  super_ImplicitKeyValueEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
                  .
                  super_ValueEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::ValueEntryData<Memory::WriteBarrierPtr<Js::FunctionBody>_>_>
                  .super_ValueEntryData<Memory::WriteBarrierPtr<Js::FunctionBody>_>.next;
          if ((long)(int)uVar7 < 0) goto LAB_009002af;
          pFVar4 = pSVar3[(int)uVar7].
                   super_DefaultHashedEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                   .
                   super_ImplicitKeyValueEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
                   .
                   super_ValueEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::ValueEntryData<Memory::WriteBarrierPtr<Js::FunctionBody>_>_>
                   .super_ValueEntryData<Memory::WriteBarrierPtr<Js::FunctionBody>_>.value.ptr;
          Memory::Recycler::WBSetBit((char *)&local_38);
          local_38 = pFVar4;
          Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_38);
        } while (local_38 != *key);
      }
      if (this->stats != (DictionaryStats *)0x0) {
        DictionaryStats::Lookup(this->stats,depth);
      }
      pSVar3 = (this->entries).ptr;
      iVar1 = pSVar3[uVar7].
              super_DefaultHashedEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
              .
              super_ImplicitKeyValueEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
              .
              super_ValueEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::ValueEntryData<Memory::WriteBarrierPtr<Js::FunctionBody>_>_>
              .super_ValueEntryData<Memory::WriteBarrierPtr<Js::FunctionBody>_>.next;
      if ((int)uVar6 < 0) {
        (this->buckets).ptr[uVar5] = iVar1;
      }
      else {
        pSVar3[uVar6].
        super_DefaultHashedEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
        .
        super_ImplicitKeyValueEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
        .
        super_ValueEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::ValueEntryData<Memory::WriteBarrierPtr<Js::FunctionBody>_>_>
        .super_ValueEntryData<Memory::WriteBarrierPtr<Js::FunctionBody>_>.next = iVar1;
      }
      Memory::Recycler::WBSetBit((char *)(pSVar3 + uVar7));
      pSVar3[uVar7].
      super_DefaultHashedEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
      .
      super_ImplicitKeyValueEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
      .
      super_ValueEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::ValueEntryData<Memory::WriteBarrierPtr<Js::FunctionBody>_>_>
      .super_ValueEntryData<Memory::WriteBarrierPtr<Js::FunctionBody>_>.value.ptr =
           (FunctionBody *)0x0;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(pSVar3 + uVar7);
      SetNextFreeEntryIndex
                (this,(this->entries).ptr + uVar7,-(uint)(this->freeCount == 0) | this->freeList);
      this->freeList = uVar7;
      this->freeCount = this->freeCount + 1;
      if (this->stats == (DictionaryStats *)0x0) {
        return true;
      }
      DictionaryStats::Remove(this->stats,(this->buckets).ptr[uVar5] == -1);
      return true;
    }
  }
LAB_009002af:
  if (this->stats != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this->stats,depth);
  }
  return false;
}

Assistant:

bool Remove(const TKey& key)
        {
            int i, last;
            uint targetBucket;
            if(FindEntryWithKey(key, &i, &last, &targetBucket))
            {
                RemoveAt(i, last, targetBucket);
                return true;
            }
            return false;
        }